

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopFocusScope(void)

{
  ImGuiContext *pIVar1;
  uint *puVar2;
  ImGuiContext *g;
  ImGuiID local_c;
  
  pIVar1 = GImGui;
  ImVector<unsigned_int>::pop_back(&GImGui->FocusScopeStack);
  if ((pIVar1->FocusScopeStack).Size == 0) {
    local_c = 0;
  }
  else {
    puVar2 = ImVector<unsigned_int>::back(&pIVar1->FocusScopeStack);
    local_c = *puVar2;
  }
  pIVar1->CurrentFocusScopeId = local_c;
  return;
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.FocusScopeStack.Size > 0); // Too many PopFocusScope() ?
    g.FocusScopeStack.pop_back();
    g.CurrentFocusScopeId = g.FocusScopeStack.Size ? g.FocusScopeStack.back() : 0;
}